

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::Parser(Parser *this,Parser *that)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  bool bVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  csubstr cVar11;
  size_t local_80;
  char msg [76];
  
  bVar10 = 0;
  (this->m_options).flags = (that->m_options).flags;
  sVar6 = (that->m_file).len;
  (this->m_file).str = (that->m_file).str;
  (this->m_file).len = sVar6;
  sVar6 = (that->m_buf).len;
  (this->m_buf).str = (that->m_buf).str;
  (this->m_buf).len = sVar6;
  this->m_root_id = that->m_root_id;
  this->m_tree = that->m_tree;
  detail::stack<c4::yml::Parser::State,_16UL>::stack(&this->m_stack,&that->m_stack);
  sVar6 = (this->m_stack).m_size;
  if (sVar6 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    msg._24_16_ = (undefined1  [16])
                  to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '\\';
    msg[9] = '\\';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    (*(code *)PTR_error_impl_00231528)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar6 = (this->m_stack).m_size;
  }
  this->m_state = (this->m_stack).m_stack + (sVar6 - 1);
  sVar6 = that->m_key_tag2_indentation;
  this->m_key_tag_indentation = that->m_key_tag_indentation;
  this->m_key_tag2_indentation = sVar6;
  sVar6 = (that->m_key_tag).len;
  (this->m_key_tag).str = (that->m_key_tag).str;
  (this->m_key_tag).len = sVar6;
  sVar6 = (that->m_key_tag2).len;
  (this->m_key_tag2).str = (that->m_key_tag2).str;
  (this->m_key_tag2).len = sVar6;
  this->m_val_tag_indentation = that->m_val_tag_indentation;
  sVar6 = (that->m_val_tag).len;
  (this->m_val_tag).str = (that->m_val_tag).str;
  (this->m_val_tag).len = sVar6;
  this->m_key_anchor_was_before = that->m_key_anchor_was_before;
  this->m_key_anchor_indentation = that->m_key_anchor_indentation;
  sVar6 = (that->m_key_anchor).len;
  (this->m_key_anchor).str = (that->m_key_anchor).str;
  (this->m_key_anchor).len = sVar6;
  this->m_val_anchor_indentation = that->m_val_anchor_indentation;
  sVar6 = (that->m_val_anchor).len;
  (this->m_val_anchor).str = (that->m_val_anchor).str;
  (this->m_val_anchor).len = sVar6;
  (this->m_filter_arena).str = (char *)0x0;
  (this->m_filter_arena).len = 0;
  (this->m_newline_offsets_buf).len = 0;
  this->m_newline_offsets = (size_t *)0x0;
  this->m_newline_offsets_size = 0;
  this->m_newline_offsets_capacity = 0;
  (this->m_newline_offsets_buf).str = (char *)0x0;
  if (that->m_newline_offsets_capacity != 0) {
    _resize_locations(this,that->m_newline_offsets_capacity);
    if (this->m_newline_offsets_capacity != that->m_newline_offsets_capacity) {
      pcVar8 = "check failed: m_newline_offsets_capacity == that.m_newline_offsets_capacity";
      pcVar9 = msg;
      for (lVar7 = 0x4c; lVar7 != 0; lVar7 = lVar7 + -1) {
        *pcVar9 = *pcVar8;
        pcVar8 = pcVar8 + (ulong)bVar10 * -2 + 1;
        pcVar9 = pcVar9 + (ulong)bVar10 * -2 + 1;
      }
      if (((byte)s_error_flags & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar11 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_80 = cVar11.len;
      auVar4 = ZEXT1224(ZEXT412(0x6af5) << 0x40);
      LVar3.name.str._0_4_ = (int)cVar11.str;
      LVar3.super_LineCol.offset = auVar4._0_8_;
      LVar3.super_LineCol.line = auVar4._8_8_;
      LVar3.super_LineCol.col = auVar4._16_8_;
      LVar3.name.str._4_4_ = cVar11.str._4_4_;
      LVar3.name.len = local_80;
      (*p_Var1)(msg,0x4c,LVar3,(this->m_stack).m_callbacks.m_user_data);
    }
    memcpy(this->m_newline_offsets,that->m_newline_offsets,that->m_newline_offsets_size << 3);
    this->m_newline_offsets_size = that->m_newline_offsets_size;
  }
  sVar6 = (that->m_filter_arena).len;
  if (sVar6 != 0) {
    _resize_filter_arena(this,sVar6);
  }
  return;
}

Assistant:

Parser::Parser(Parser const& that)
    : m_options(that.m_options)
    , m_file(that.m_file)
    , m_buf(that.m_buf)
    , m_root_id(that.m_root_id)
    , m_tree(that.m_tree)
    , m_stack(that.m_stack)
    , m_state(&m_stack.top())
    , m_key_tag_indentation(that.m_key_tag_indentation)
    , m_key_tag2_indentation(that.m_key_tag2_indentation)
    , m_key_tag(that.m_key_tag)
    , m_key_tag2(that.m_key_tag2)
    , m_val_tag_indentation(that.m_val_tag_indentation)
    , m_val_tag(that.m_val_tag)
    , m_key_anchor_was_before(that.m_key_anchor_was_before)
    , m_key_anchor_indentation(that.m_key_anchor_indentation)
    , m_key_anchor(that.m_key_anchor)
    , m_val_anchor_indentation(that.m_val_anchor_indentation)
    , m_val_anchor(that.m_val_anchor)
    , m_filter_arena()
    , m_newline_offsets()
    , m_newline_offsets_size()
    , m_newline_offsets_capacity()
    , m_newline_offsets_buf()
{
    if(that.m_newline_offsets_capacity)
    {
        _resize_locations(that.m_newline_offsets_capacity);
        _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity == that.m_newline_offsets_capacity);
        memcpy(m_newline_offsets, that.m_newline_offsets, that.m_newline_offsets_size * sizeof(size_t));
        m_newline_offsets_size = that.m_newline_offsets_size;
    }
    if(that.m_filter_arena.len)
    {
        _resize_filter_arena(that.m_filter_arena.len);
    }
}